

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

uint xmlHashValue(uint seed,xmlChar *key,xmlChar *key2,xmlChar *key3,size_t *lengths)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  byte bVar8;
  
  uVar2 = seed ^ 0x3b00;
  uVar6 = seed << 0xf | seed >> 0x11;
  sVar7 = 0;
  bVar8 = *key;
  while (bVar8 != 0) {
    uVar2 = (bVar8 + uVar2) * 9;
    uVar6 = ((uVar6 + uVar2) * 0x80 | uVar6 + uVar2 >> 0x19) * 5;
    lVar1 = sVar7 + 1;
    sVar7 = sVar7 + 1;
    bVar8 = key[lVar1];
  }
  if (lengths != (size_t *)0x0) {
    *lengths = sVar7;
  }
  iVar5 = uVar2 * 9;
  iVar3 = ((uVar6 + iVar5) * 0x80 | uVar6 + iVar5 >> 0x19) * 5;
  if (key2 != (xmlChar *)0x0) {
    sVar7 = 0;
    bVar8 = *key2;
    while (bVar8 != 0) {
      iVar5 = ((uint)bVar8 + iVar5) * 9;
      iVar3 = ((iVar3 + iVar5) * 0x80 | (uint)(iVar3 + iVar5) >> 0x19) * 5;
      lVar1 = sVar7 + 1;
      sVar7 = sVar7 + 1;
      bVar8 = key2[lVar1];
    }
    if (lengths != (size_t *)0x0) {
      lengths[1] = sVar7;
    }
  }
  uVar6 = iVar5 * 9;
  uVar2 = ((iVar3 + uVar6) * 0x80 | iVar3 + uVar6 >> 0x19) * 5;
  if (key3 != (xmlChar *)0x0) {
    sVar7 = 0;
    bVar8 = *key3;
    while (bVar8 != 0) {
      uVar6 = (bVar8 + uVar6) * 9;
      uVar2 = ((uVar2 + uVar6) * 0x80 | uVar2 + uVar6 >> 0x19) * 5;
      lVar1 = sVar7 + 1;
      sVar7 = sVar7 + 1;
      bVar8 = key3[lVar1];
    }
    if (lengths != (size_t *)0x0) {
      lengths[2] = sVar7;
    }
  }
  uVar6 = (uVar2 << 0xe | uVar2 >> 0x12) + (uVar6 ^ uVar2);
  uVar4 = (uVar6 * 0x4000000 | uVar6 >> 6) + (uVar2 ^ uVar6);
  uVar2 = (uVar4 * 0x20 | uVar4 >> 0x1b) + (uVar6 ^ uVar4);
  return (uVar2 * 0x1000000 | uVar2 >> 8) + (uVar4 ^ uVar2);
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlHashValue(unsigned seed, const xmlChar *key, const xmlChar *key2,
             const xmlChar *key3, size_t *lengths) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; key[i] != 0; i++) {
        HASH_UPDATE(h1, h2, key[i]);
    }
    if (lengths)
        lengths[0] = i;

    HASH_UPDATE(h1, h2, 0);

    if (key2 != NULL) {
        for (i = 0; key2[i] != 0; i++) {
            HASH_UPDATE(h1, h2, key2[i]);
        }
        if (lengths)
            lengths[1] = i;
    }

    HASH_UPDATE(h1, h2, 0);

    if (key3 != NULL) {
        for (i = 0; key3[i] != 0; i++) {
            HASH_UPDATE(h1, h2, key3[i]);
        }
        if (lengths)
            lengths[2] = i;
    }

    HASH_FINISH(h1, h2);

    return(h2);
}